

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_wsi_mux_apply_queue(lws *wsi)

{
  lws *wsi_00;
  lws_dll2 *plVar1;
  lws_dll2 *d;
  lws_role_ops *plVar2;
  
  plVar1 = (wsi->dll2_cli_txn_queue_owner).head;
  while (d = plVar1, d != (lws_dll2 *)0x0) {
    plVar1 = d->next;
    wsi_00 = (lws *)(d + -0x13);
    plVar2 = wsi->role_ops;
    if ((plVar2 == &role_ops_h1 || plVar2 == &role_ops_h2) &&
       (*(short *)((long)&d[10].next + 4) == 0x10f)) {
      _lws_log(8,"%s: cli pipeq %p to be h2\n","lws_wsi_mux_apply_queue",wsi_00);
      *(uint *)((long)&d[10].next + 4) = (uint)*(ushort *)((long)&d[10].next + 6) << 0x10 | 0x13;
      _lws_log(0x10,"lwsi_set_state(%p, 0x%lx)\n",wsi_00);
      lws_dll2_remove(d);
      lws_wsi_h2_adopt(wsi,wsi_00);
      plVar2 = wsi->role_ops;
    }
    if ((plVar2 == &role_ops_mqtt) && ((short)wsi->wsistate == 0x119)) {
      _lws_log(8,"%s: cli pipeq %p to be mqtt\n","lws_wsi_mux_apply_queue",wsi_00);
      lws_dll2_remove(d);
      lws_wsi_mqtt_adopt(wsi,wsi_00);
    }
  }
  return 0;
}

Assistant:

int
lws_wsi_mux_apply_queue(struct lws *wsi)
{
	/* we have a transaction queue that wants to pipeline */

	lws_vhost_lock(wsi->vhost);

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   wsi->dll2_cli_txn_queue_owner.head) {
		struct lws *w = lws_container_of(d, struct lws,
						 dll2_cli_txn_queue);

#if defined(LWS_ROLE_H2)
		if (lwsi_role_http(wsi) &&
		    lwsi_state(w) == LRS_H2_WAITING_TO_SEND_HEADERS) {
			lwsl_info("%s: cli pipeq %p to be h2\n", __func__, w);

			lwsi_set_state(w, LRS_H1C_ISSUE_HANDSHAKE2);

			/* remove ourselves from client queue */
			lws_dll2_remove(&w->dll2_cli_txn_queue);

			/* attach ourselves as an h2 stream */
			lws_wsi_h2_adopt(wsi, w);
		}
#endif

#if defined(LWS_ROLE_MQTT)
		if (lwsi_role_mqtt(wsi) &&
		    lwsi_state(wsi) == LRS_ESTABLISHED) {
			lwsl_info("%s: cli pipeq %p to be mqtt\n", __func__, w);

			/* remove ourselves from client queue */
			lws_dll2_remove(&w->dll2_cli_txn_queue);

			/* attach ourselves as an h2 stream */
			lws_wsi_mqtt_adopt(wsi, w);
		}
#endif

	} lws_end_foreach_dll_safe(d, d1);

	lws_vhost_unlock(wsi->vhost);

	return 0;
}